

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketTest2.cpp
# Opt level: O0

void __thiscall TcpSocketTest::test2(TcpSocketTest *this)

{
  undefined1 local_2a4 [4];
  undefined4 local_2a0;
  uint32_t new_number;
  uint32_t number;
  int res;
  Address client_addr;
  Address server_addr;
  ServerSocket server;
  Socket sock4;
  Socket sock3;
  Socket sock2;
  Socket sock;
  TcpSocketTest *this_local;
  
  this->delay = true;
  JetHead::Socket::Socket((Socket *)&stack0xffffffffffffff80,true);
  JetHead::Socket::Socket((Socket *)&stack0xffffffffffffff10,true);
  JetHead::Socket::Socket((Socket *)&stack0xfffffffffffffe90,true);
  JetHead::Socket::Socket((Socket *)&stack0xfffffffffffffe20,true);
  JetHead::ServerSocket::ServerSocket((ServerSocket *)(server_addr.mName + 8),true);
  JetHead::Socket::Address::Address((Address *)(client_addr.mName + 8));
  JetHead::Socket::Address::Address((Address *)&number);
  new_number = JetHead::ServerSocket::bind((Address *)(server_addr.mName + 8));
  if ((int)new_number < 0) {
    jh_log_print(3,"void TcpSocketTest::test2()",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/SocketTest2.cpp"
                 ,0x1b2,"Bind Failed");
  }
  new_number = JetHead::ServerSocket::listen((int)&server_addr + 0x1c);
  if ((int)new_number < 0) {
    jh_log_print(3,"void TcpSocketTest::test2()",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/SocketTest2.cpp"
                 ,0x1b7,"Listen Failed");
  }
  new_number = JetHead::Socket::getLocalAddress((Address *)(server_addr.mName + 8));
  JetHead::Socket::Address::setAddress(client_addr.mName + 8);
  if ((int)new_number < 0) {
    jh_log_print(3,"void TcpSocketTest::test2()",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/SocketTest2.cpp"
                 ,0x1bd,"get local addr failed");
  }
  JetHead::Socket::setSelector
            ((SocketListener *)(server_addr.mName + 8),(Selector *)&this->super_SocketListener);
  new_number = JetHead::Socket::connect((Address *)&stack0xffffffffffffff80);
  if ((int)new_number < 0) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/SocketTest2.cpp"
               ,0x1c5,"connect failed: %d.",(ulong)new_number);
  }
  new_number = JetHead::Socket::connect((Address *)&stack0xffffffffffffff10);
  if ((int)new_number < 0) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/SocketTest2.cpp"
               ,0x1c9,"connect failed: %d.",(ulong)new_number);
  }
  new_number = JetHead::Socket::connect((Address *)&stack0xffffffffffffff10);
  if (new_number != 0xffffffff) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/SocketTest2.cpp"
               ,0x1cd,"connect should only work once: %d.",(ulong)new_number);
  }
  new_number = JetHead::Socket::connect((Address *)&stack0xfffffffffffffe20);
  if ((int)new_number < 0) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/SocketTest2.cpp"
               ,0x1d1,"connect failed: %d.",(ulong)new_number);
  }
  local_2a0 = 1000;
  new_number = JetHead::Socket::write(&stack0xfffffffffffffe20,(int)&local_2a0);
  if ((int)new_number < 0) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/SocketTest2.cpp"
               ,0x1db,"write failed");
  }
  JetHead::Socket::close();
  JetHead::Socket::setReadTimeout((Socket *)&stack0xffffffffffffff80,1);
  if ((int)new_number < 0) {
    jh_log_print(3,"void TcpSocketTest::test2()",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/SocketTest2.cpp"
                 ,0x1e5,"connect failed");
  }
  new_number = JetHead::Socket::write(&stack0xffffffffffffff80,(int)&local_2a0);
  if ((int)new_number < 0) {
    jh_log_print(3,"void TcpSocketTest::test2()",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/SocketTest2.cpp"
                 ,0x1ea,"write failed");
  }
  new_number = JetHead::Socket::read(&stack0xffffffffffffff80,(int)local_2a4);
  if (0 < (int)new_number) {
    jh_log_print(3,"void TcpSocketTest::test2()",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/SocketTest2.cpp"
                 ,0x1fa,"timeout failed");
  }
  this->mTestState = 0;
  JetHead::Socket::close();
  JetHead::Socket::setReadTimeout((Socket *)&stack0xfffffffffffffe90,0);
  new_number = JetHead::Socket::connect((Address *)&stack0xfffffffffffffe90);
  if ((int)new_number < 0) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/SocketTest2.cpp"
               ,0x207,"connect failed: %d.",(ulong)new_number);
  }
  local_2a0 = 0x3ea;
  new_number = JetHead::Socket::write(&stack0xfffffffffffffe90,(int)&local_2a0);
  new_number = JetHead::Socket::write(&stack0xfffffffffffffe90,(int)&local_2a0);
  this->delay = false;
  JetHead::Socket::setSelector((SocketListener *)(server_addr.mName + 8),(Selector *)0x0);
  JetHead::Socket::Address::~Address((Address *)&number);
  JetHead::Socket::Address::~Address((Address *)(client_addr.mName + 8));
  JetHead::ServerSocket::~ServerSocket((ServerSocket *)(server_addr.mName + 8));
  JetHead::Socket::~Socket((Socket *)&stack0xfffffffffffffe20);
  JetHead::Socket::~Socket((Socket *)&stack0xfffffffffffffe90);
  JetHead::Socket::~Socket((Socket *)&stack0xffffffffffffff10);
  JetHead::Socket::~Socket((Socket *)&stack0xffffffffffffff80);
  return;
}

Assistant:

void TcpSocketTest::test2()

{
        delay = true;
        Socket sock, sock2, sock3, sock4;
	ServerSocket server;
	Socket::Address server_addr, client_addr;
	
	int res = server.bind( server_addr );

	if ( res < 0 )
		LOG_WARN_PERROR( "Bind Failed" );

	res = server.listen( 1 );

	if ( res < 0 )
		LOG_WARN_PERROR( "Listen Failed" );
	
	res = server.getLocalAddress( server_addr );
	server_addr.setAddress( "127.0.0.1" );
	
	if ( res < 0 )
		LOG_WARN_PERROR( "get local addr failed" );
	
	LOG_NOTICE( "Server name %s:%d", server_addr.getName(), server_addr.getPort() );
	

	server.setSelector( this, mSelector );
	res = sock.connect( server_addr );
	if (res < 0)
	  TestFailed("connect failed: %d.", res);

	res = sock2.connect( server_addr );
	if (res < 0)
	  TestFailed("connect failed: %d.", res);
	
	res = sock2.connect(server_addr);
	if (res != -1)
	  TestFailed("connect should only work once: %d.", res);

	res = sock4.connect(server_addr);
	if (res < 0)
	  TestFailed("connect failed: %d.", res);
	
	

	uint32_t number = 1000;
	uint32_t new_number;

	res = sock4.write( &number, 4 );
	
	if ( res < 0 )
	  TestFailed( "write failed" );
	
	//sock4.shutdown();
	sock2.close();

	
	
	sock.setReadTimeout(1);

	if ( res < 0 )
		LOG_WARN_PERROR( "connect failed" );

	res = sock.write( &number, 4 );
	
	if ( res < 0 )
		LOG_WARN_PERROR( "write failed" );


	// The goal was to test to make sure listen works
	// but it appears that tcp just waits it out, so this doesn't
	// work
	//	res = sock2.write( &number, 4 );
	//if ( res > 0 )
	//TestFailed("Server accepts too many connections: %d.", res);


	// the timeout is set smaller than the delay
	// therefore this fail.

	res = sock.read( &new_number, 4 );
	if ( res > 0 )
		LOG_WARN_PERROR( "timeout failed" );


	mTestState = 0;

	sock.close();
	
	
       	
	sock3.setReadTimeout(0);

	res = sock3.connect( server_addr );
	if (res < 0)
	  TestFailed("connect failed: %d.", res);
	number = 1002;
	res = sock3.write(&number, 4);
	//	cerr << res << endl;
	res = sock3.write(&number, 4);
	//cerr << res << endl;

	
	// The goal here was to test the timeour feature of
	// the socket, but since we can't sleep for a sufficent
	// legnth of time we are sol.
	//	res = sock3.read(&new_number, 4);
	//if ( res > 0 )
	//TestFailed("setReadTiemout ignored");



	
	delay = false;

	server.setSelector((SocketListener*)NULL, NULL);
}